

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum_K256.h
# Opt level: O2

void Hacl_EC_K256_felem_sub(uint64_t *a,uint64_t *b,uint64_t *out)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  
  uVar1 = a[4];
  uVar2 = b[4];
  uVar3 = a[1];
  uVar4 = a[2];
  uVar5 = a[3];
  uVar6 = b[1];
  uVar7 = b[2];
  uVar8 = b[3];
  *out = (*a - *b) + 0x3ffffbfffff0bc;
  out[1] = (uVar3 - uVar6) + 0x3ffffffffffffc;
  out[2] = (uVar4 - uVar7) + 0x3ffffffffffffc;
  out[3] = (uVar5 - uVar8) + 0x3ffffffffffffc;
  out[4] = (uVar1 - uVar2) + 0x3fffffffffffc;
  Hacl_K256_Field_fnormalize_weak(out,out);
  return;
}

Assistant:

static inline void Hacl_K256_Field_fsub(uint64_t *out, uint64_t *f1, uint64_t *f2, uint64_t x)
{
  uint64_t a0 = f1[0U];
  uint64_t a1 = f1[1U];
  uint64_t a2 = f1[2U];
  uint64_t a3 = f1[3U];
  uint64_t a4 = f1[4U];
  uint64_t b0 = f2[0U];
  uint64_t b1 = f2[1U];
  uint64_t b2 = f2[2U];
  uint64_t b3 = f2[3U];
  uint64_t b4 = f2[4U];
  uint64_t r00 = 9007190664804446ULL * x - b0;
  uint64_t r10 = 9007199254740990ULL * x - b1;
  uint64_t r20 = 9007199254740990ULL * x - b2;
  uint64_t r30 = 9007199254740990ULL * x - b3;
  uint64_t r40 = 562949953421310ULL * x - b4;
  uint64_t r0 = r00;
  uint64_t r1 = r10;
  uint64_t r2 = r20;
  uint64_t r3 = r30;
  uint64_t r4 = r40;
  uint64_t o0 = a0 + r0;
  uint64_t o1 = a1 + r1;
  uint64_t o2 = a2 + r2;
  uint64_t o3 = a3 + r3;
  uint64_t o4 = a4 + r4;
  uint64_t f0 = o0;
  uint64_t f11 = o1;
  uint64_t f21 = o2;
  uint64_t f3 = o3;
  uint64_t f4 = o4;
  out[0U] = f0;
  out[1U] = f11;
  out[2U] = f21;
  out[3U] = f3;
  out[4U] = f4;
}